

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quad_value_bit_vector.h
# Opt level: O1

uchar __thiscall bsim::quad_value_bit_vector::to_type<unsigned_char>(quad_value_bit_vector *this)

{
  byte bVar1;
  uchar uVar2;
  char cVar3;
  long lVar4;
  
  if ((long)this->N < 1) {
    uVar2 = '\0';
  }
  else {
    cVar3 = '\x01';
    lVar4 = 0;
    uVar2 = '\0';
    do {
      bVar1 = (this->bits).super__Vector_base<bsim::quad_value,_std::allocator<bsim::quad_value>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar4].value;
      if (1 < bVar1) {
        __assert_fail("(value == 1) || (value == 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dillonhuff[P]bsim/./src/quad_value_bit_vector.h"
                      ,0x78,"unsigned char bsim::quad_value::binary_value() const");
      }
      uVar2 = uVar2 + bVar1 * cVar3;
      cVar3 = cVar3 * '\x02';
      lVar4 = lVar4 + 1;
    } while (this->N != lVar4);
  }
  return uVar2;
}

Assistant:

ConvType to_type() const {
      ConvType tmp = 0;
      ConvType exp = 1;
      for (int i = 0; i < bitLength(); i++) {
        tmp += exp*get(i).binary_value();
        exp *= 2;
      }
      return tmp;
      // ConvType tmp = *(const_cast<ConvType*>((const ConvType*) (&(bits[0]))));
      // //TODO FIXME I am a sketchy hack.
      // ConvType mask = sizeof(ConvType) > bits.size() ? (1<<N)-1 : -1; 
      // return tmp & mask;
    }